

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::BufferStorageTest::iterate(BufferStorageTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *pNVar6;
  reference ppBVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  char *local_440;
  char *local_3b0;
  MessageBuilder local_3a8;
  char *local_228;
  MessageBuilder local_220;
  __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
  local_a0;
  __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
  local_98;
  TestCasesVectorIterator itTestCase;
  uint local_88;
  GLint flags;
  uint n_flag_combination;
  deUint32 local_60;
  ContextType local_5c;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  long lStack_18;
  bool result;
  Functions *gl;
  BufferStorageTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar2);
  local_19 = 1;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_sparse_buffer");
  if (!bVar1) {
    local_55 = 1;
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_ARB_sparse_buffer is not supported",&local_41);
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_40);
    local_55 = 0;
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  local_5c.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  local_60 = (deUint32)glu::ApiType::core(4,3);
  bVar1 = glu::contextSupports(local_5c,(ApiType)local_60);
  if (!bVar1) {
    flags._2_1_ = 1;
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n_flag_combination,
               "GL_ARB_sparse_buffer conformance tests require OpenGL 4.3 core feature-set",
               (allocator<char> *)((long)&flags + 3));
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)&n_flag_combination);
    flags._2_1_ = 0;
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  initTestCases(this);
  local_88 = 0;
  do {
    if (0xf < local_88) {
LAB_01180eb8:
      if ((local_19 & 1) == 0) {
        local_440 = "Fail";
      }
      else {
        local_440 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)((local_19 & 1) == 0),local_440);
      return STOP;
    }
    uVar4 = 0;
    if ((local_88 & 1) != 0) {
      uVar4 = 0x200;
    }
    uVar10 = 0;
    if ((local_88 & 2) != 0) {
      uVar10 = 0x100;
    }
    uVar11 = 0;
    if ((local_88 & 4) != 0) {
      uVar11 = 0x80;
    }
    uVar12 = 0;
    if ((local_88 & 8) != 0) {
      uVar12 = 0x40;
    }
    itTestCase._M_current._4_4_ = uVar4 | uVar10 | uVar11 | uVar12 | 0x400;
    if ((uVar12 == 0) && (uVar11 == 0)) {
      (**(code **)(lStack_18 + 0x6c8))(1,&this->m_sparse_bo);
      dVar3 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar3,"glGenBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a5e);
      (**(code **)(lStack_18 + 0x40))(0x8892,this->m_sparse_bo);
      dVar3 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar3,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a61);
      (**(code **)(lStack_18 + 0x160))(0x8892,0x3e8c0000,0,itTestCase._M_current._4_4_);
      dVar3 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar3,"glBufferStorage() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a67);
      local_98._M_current =
           (BufferStorageTestCase **)
           std::
           vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
           ::begin(&this->m_testCases);
      while( true ) {
        local_a0._M_current =
             (BufferStorageTestCase **)
             std::
             vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
             ::end(&this->m_testCases);
        bVar1 = __gnu_cxx::operator!=(&local_98,&local_a0);
        if (!bVar1) break;
        (**(code **)(lStack_18 + 0x40))(0x8892,this->m_sparse_bo);
        dVar3 = (**(code **)(lStack_18 + 0x800))();
        glu::checkError(dVar3,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x1a6c);
        ppBVar7 = __gnu_cxx::
                  __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
                  ::operator*(&local_98);
        uVar4 = (*(*ppBVar7)->_vptr_BufferStorageTestCase[6])(*ppBVar7,(ulong)this->m_sparse_bo);
        if ((uVar4 & 1) == 0) {
          pTVar8 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_220,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<(&local_220,(char (*) [12])"Test case [");
          ppBVar7 = __gnu_cxx::
                    __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
                    ::operator*(&local_98);
          iVar2 = (*(*ppBVar7)->_vptr_BufferStorageTestCase[4])();
          local_228 = (char *)CONCAT44(extraout_var_00,iVar2);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_228);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [28])"] has failed to initialize.");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_220);
          local_19 = 0;
          goto LAB_01180eb8;
        }
        ppBVar7 = __gnu_cxx::
                  __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
                  ::operator*(&local_98);
        uVar4 = (*(*ppBVar7)->_vptr_BufferStorageTestCase[3])
                          (*ppBVar7,(ulong)itTestCase._M_current._4_4_);
        if ((uVar4 & 1) == 0) {
          pTVar8 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_3a8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<(&local_3a8,(char (*) [12])"Test case [");
          ppBVar7 = __gnu_cxx::
                    __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
                    ::operator*(&local_98);
          iVar2 = (*(*ppBVar7)->_vptr_BufferStorageTestCase[4])();
          local_3b0 = (char *)CONCAT44(extraout_var_01,iVar2);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_3b0);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [35])"] has failed to execute correctly.");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3a8);
          local_19 = 0;
        }
        ppBVar7 = __gnu_cxx::
                  __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
                  ::operator*(&local_98);
        (*(*ppBVar7)->_vptr_BufferStorageTestCase[7])();
        __gnu_cxx::
        __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
        ::operator++(&local_98);
      }
      (**(code **)(lStack_18 + 0x438))(1,&this->m_sparse_bo);
      dVar3 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar3,"glDeleteBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a88);
      this->m_sparse_bo = 0;
    }
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult BufferStorageTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Only execute if the implementation supports the GL_ARB_sparse_buffer extension */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer"))
	{
		throw tcu::NotSupportedError("GL_ARB_sparse_buffer is not supported");
	}

	/* The buffer storage test cases require OpenGL 4.3 feature-set. */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 3)))
	{
		throw tcu::NotSupportedError("GL_ARB_sparse_buffer conformance tests require OpenGL 4.3 core feature-set");
	}

	/* Register & initialize the test case objects */
	initTestCases();

	/* Iterate over all sparse BO flag combinations. We need to consider a total of 4 flags:
	 *
	 * - GL_CLIENT_STORAGE_BIT  (bit 0)
	 * - GL_DYNAMIC_STORAGE_BIT (bit 1)
	 * - GL_MAP_COHERENT_BIT    (bit 2)
	 * - GL_MAP_PERSISTENT_BIT  (bit 3)
	 *
	 *  GL_MAP_READ_BIT and GL_MAP_WRITE_BIT are excluded, since they are incompatible
	 *  with sparse buffers by definition.
	 *
	 *  GL_SPARSE_STORAGE_BIT_ARB is assumed to be always defined. Some of the combinations are invalid.
	 *  Such loop iterations will be skipped.
	 * */

	for (unsigned int n_flag_combination = 0; n_flag_combination < (1 << 4); ++n_flag_combination)
	{
		const glw::GLint flags = ((n_flag_combination & (1 << 0)) ? GL_CLIENT_STORAGE_BIT : 0) |
								 ((n_flag_combination & (1 << 1)) ? GL_DYNAMIC_STORAGE_BIT : 0) |
								 ((n_flag_combination & (1 << 2)) ? GL_MAP_COHERENT_BIT : 0) |
								 ((n_flag_combination & (1 << 3)) ? GL_MAP_PERSISTENT_BIT : 0) |
								 GL_SPARSE_STORAGE_BIT_ARB;

		if ((flags & GL_MAP_PERSISTENT_BIT) != 0)
		{
			if ((flags & GL_MAP_READ_BIT) == 0 && (flags & GL_MAP_WRITE_BIT) == 0)
			{
				continue;
			}
		}

		if (((flags & GL_MAP_COHERENT_BIT) != 0) && ((flags & GL_MAP_PERSISTENT_BIT) == 0))
		{
			continue;
		}

		/* Set up the sparse BO */
		gl.genBuffers(1, &m_sparse_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

		gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

		gl.bufferStorage(GL_ARRAY_BUFFER, 1024768 * 1024, /* as per test spec */
						 DE_NULL,						  /* data */
						 flags);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferStorage() call failed.");

		for (TestCasesVectorIterator itTestCase = m_testCases.begin(); itTestCase != m_testCases.end(); ++itTestCase)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

			if (!(*itTestCase)->initTestCaseIteration(m_sparse_bo))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Test case [" << (*itTestCase)->getName()
								   << "] "
									  "has failed to initialize."
								   << tcu::TestLog::EndMessage;

				result = false;
				goto end;
			}

			if (!(*itTestCase)->execute(flags))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Test case [" << (*itTestCase)->getName()
								   << "] "
									  "has failed to execute correctly."
								   << tcu::TestLog::EndMessage;

				result = false;
			} /* if (!testCaseResult) */

			(*itTestCase)->deinitTestCaseIteration();
		} /* for (all added test cases) */

		/* Release the sparse BO */
		gl.deleteBuffers(1, &m_sparse_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers() call failed.");

		m_sparse_bo = 0;
	}

end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}